

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  ushort uVar1;
  ushort uVar2;
  ObjectValues *pOVar3;
  ObjectValues *pOVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ushort uVar12;
  uint *__s;
  uint *__s_00;
  bool bVar13;
  String local_48;
  size_t sVar11;
  
  uVar1 = *(ushort *)&this->bits_;
  uVar2 = *(ushort *)&other->bits_;
  uVar12 = uVar2 & 0xff;
  bVar13 = (uVar1 & 0xff) < uVar12;
  if ((uVar1 & 0xff) == uVar12) {
    switch((char)uVar1) {
    case '\0':
      bVar13 = false;
      break;
    case '\x01':
      bVar13 = (this->value_).int_ < (other->value_).int_;
      break;
    case '\x02':
      bVar13 = (this->value_).uint_ < (other->value_).uint_;
      break;
    case '\x03':
      bVar13 = (this->value_).real_ <= (other->value_).real_ &&
               (other->value_).real_ != (this->value_).real_;
      break;
    case '\x04':
      __s = (uint *)(this->value_).string_;
      __s_00 = (uint *)(other->value_).string_;
      if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
        bVar13 = __s_00 != (uint *)0x0;
      }
      else {
        if ((uVar1 >> 8 & 1) == 0) {
          sVar11 = strlen((char *)__s);
          uVar8 = (uint)sVar11;
        }
        else {
          uVar8 = *__s;
          __s = __s + 1;
        }
        if ((uVar2 >> 8 & 1) == 0) {
          sVar11 = strlen((char *)__s_00);
          uVar9 = (uint)sVar11;
        }
        else {
          uVar9 = *__s_00;
          __s_00 = __s_00 + 1;
        }
        if ((__s == (uint *)0x0) || (__s_00 == (uint *)0x0)) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"assert json failed","");
          throwLogicError(&local_48);
        }
        uVar7 = uVar8;
        if (uVar9 < uVar8) {
          uVar7 = uVar9;
        }
        iVar10 = memcmp(__s,__s_00,(ulong)uVar7);
        bVar13 = true;
        if (-1 < iVar10) {
          bVar13 = uVar8 < uVar9 && iVar10 == 0;
        }
      }
      break;
    case '\x05':
      bVar13 = (this->value_).bool_ < (other->value_).bool_;
      break;
    case '\x06':
    case '\a':
      pOVar3 = (this->value_).map_;
      pOVar4 = (other->value_).map_;
      uVar5 = (pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      uVar6 = (pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      bVar13 = uVar6 < uVar5;
      if (uVar6 == uVar5) {
        bVar13 = std::
                 __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,__gnu_cxx::__ops::_Iter_less_iter>
                           ((pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            &(pOVar3->_M_t)._M_impl.super__Rb_tree_header,
                            (pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            &(pOVar4->_M_t)._M_impl.super__Rb_tree_header);
        return bVar13;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x217,"bool Json::Value::operator<(const Value &) const");
    }
  }
  return bVar13;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}